

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  jpeg_error_mgr *pjVar1;
  JHUFF_TBL *pJVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  d_derived_tbl *pdVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  char huffsize [257];
  uint huffcode [257];
  
  if (3 < (uint)tblno) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x32;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar2 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar2 == (JHUFF_TBL *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x32;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pdVar6 = *pdtbl;
  if (pdVar6 == (d_derived_tbl *)0x0) {
    pdVar6 = (d_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x528);
    *pdtbl = pdVar6;
  }
  pdVar6->pub = pJVar2;
  uVar7 = 0;
  lVar11 = 1;
  while( true ) {
    iVar4 = (int)uVar7;
    if (lVar11 == 0x11) break;
    bVar9 = pJVar2->bits[lVar11];
    if (0x100 < (int)(iVar4 + (uint)bVar9)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 8;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    for (lVar8 = 0; (uint)bVar9 != (uint)lVar8; lVar8 = lVar8 + 1) {
      huffsize[lVar8 + iVar4] = (char)lVar11;
    }
    uVar7 = (ulong)(iVar4 + (uint)lVar8);
    lVar11 = lVar11 + 1;
  }
  huffsize[iVar4] = '\0';
  iVar15 = (int)huffsize[0];
  uVar10 = 0;
  lVar11 = 1;
  lVar8 = 0;
  while (huffsize[0] != '\0') {
    lVar14 = lVar8 << 0x20;
    lVar8 = (long)(int)lVar8;
    uVar5 = uVar10;
    uVar10 = uVar10 * 2;
    while (iVar15 == huffsize[0]) {
      huffcode[lVar8] = uVar5;
      lVar3 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      uVar5 = uVar5 + 1;
      lVar14 = lVar14 + 0x100000000;
      uVar10 = uVar10 + 2;
      huffsize[0] = huffsize[lVar3];
    }
    if (1L << ((byte)iVar15 & 0x3f) <= (long)(ulong)uVar5) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 8;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    iVar15 = iVar15 + 1;
    huffsize[0] = huffsize[lVar14 >> 0x20];
  }
  lVar14 = 0;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar12 = 0xffffffffffffffff;
    if (pJVar2->bits[lVar8 + 1] != '\0') {
      lVar14 = (long)(int)lVar14;
      pdVar6->valoffset[lVar8 + 1] = lVar14 - (ulong)huffcode[lVar14];
      lVar14 = (ulong)pJVar2->bits[lVar8 + 1] + lVar14;
      uVar12 = (ulong)huffcode[lVar14 + -1];
    }
    pdVar6->maxcode[lVar8 + 1] = uVar12;
  }
  pdVar6->valoffset[0x11] = 0;
  pdVar6->maxcode[0x11] = 0xfffff;
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    pdVar6->lookup[lVar8] = 0x900;
  }
  lVar8 = 0;
  for (; lVar11 != 9; lVar11 = lVar11 + 1) {
    bVar9 = 8 - (char)lVar11;
    lVar8 = (long)(int)lVar8;
    for (uVar10 = 1; uVar10 <= pJVar2->bits[lVar11]; uVar10 = uVar10 + 1) {
      piVar13 = pdVar6->lookup + (int)(huffcode[lVar8] << (bVar9 & 0x1f));
      for (iVar15 = 1 << (bVar9 & 0x1f); 0 < iVar15; iVar15 = iVar15 + -1) {
        *piVar13 = (uint)pJVar2->huffval[lVar8] | (int)lVar11 << 8;
        piVar13 = piVar13 + 1;
      }
      lVar8 = lVar8 + 1;
    }
  }
  if (isDC != 0) {
    uVar12 = 0;
    if (iVar4 < 1) {
      uVar7 = uVar12;
    }
    for (; uVar7 != uVar12; uVar12 = uVar12 + 1) {
      if (0xf < pJVar2->huffval[uVar12]) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 8;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_make_d_derived_tbl(j_decompress_ptr cinfo, boolean isDC, int tblno,
                        d_derived_tbl **pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;             /* fill in back link */

  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int)htbl->bits[l];
    if (i < 0 || p + i > 256)   /* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char)l;
  }
  huffsize[p] = 0;
  numsymbols = p;

  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int)huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((JLONG)code) >= (((JLONG)1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (JLONG)p - (JLONG)huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p - 1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;    /* -1 if no codes of this length */
    }
  }
  dtbl->valoffset[17] = 0;
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  for (i = 0; i < (1 << HUFF_LOOKAHEAD); i++)
    dtbl->lookup[i] = (HUFF_LOOKAHEAD + 1) << HUFF_LOOKAHEAD;

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int)htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD - l);
      for (ctr = 1 << (HUFF_LOOKAHEAD - l); ctr > 0; ctr--) {
        dtbl->lookup[lookbits] = (l << HUFF_LOOKAHEAD) | htbl->huffval[p];
        lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
        ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}